

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O2

void cppwinrt::write_abi_params(writer *w,method_signature *method_signature)

{
  TypeSig *first;
  optional<winmd::reader::TypeSig> *type;
  bool bVar1;
  pointer ppVar2;
  bool bVar3;
  ParamAttributes PVar4;
  ParamSig *pPVar5;
  pointer this;
  separator s;
  string_view local_78;
  method_signature *local_60;
  string_view local_58;
  anon_class_8_1_89897ddb_conflict7 local_48;
  separator local_40;
  
  bVar1 = w->abi_types;
  w->abi_types = true;
  local_40.first = true;
  ppVar2 = (method_signature->m_params).
           super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = method_signature;
  local_40.w = w;
  for (this = (method_signature->m_params).
              super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != ppVar2; this = this + 1) {
    separator::operator()(&local_40);
    if ((this->second->m_type).m_is_szarray == true) {
      local_78._M_len = 0;
      local_78._M_str = (char *)0x0;
      PVar4 = winmd::reader::Param::Flags(&this->first);
      if (((ushort)PVar4.super_AttributesBase<unsigned_short>.value & 1) == 0) {
        pPVar5 = this->second;
        if (pPVar5->m_byref == true) {
          local_78._M_len = 0xe;
          local_78._M_str = "uint32_t*%, %*";
        }
        else {
          local_78._M_len = 0xc;
          local_78._M_str = "uint32_t%, %";
        }
      }
      else {
        local_78._M_len = 0xc;
        local_78._M_str = "uint32_t%, %";
        pPVar5 = this->second;
      }
      local_58._M_len = (size_t)this;
      local_48.args = &pPVar5->m_type;
      writer_base<cppwinrt::writer>::
      write_segment<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                (&w->super_writer_base<cppwinrt::writer>,&local_78,
                 (anon_class_8_1_89897ddb_conflict6 *)&local_58,&local_48);
    }
    else {
      PVar4 = winmd::reader::Param::Flags(&this->first);
      pPVar5 = this->second;
      first = &pPVar5->m_type;
      if (((ushort)PVar4.super_AttributesBase<unsigned_short>.value & 1) == 0) {
        write_abi_arg_out(w,first);
      }
      else {
        if (*(__index_type *)
             ((long)&(pPVar5->m_type).m_type.
                     super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     .
                     super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
             + 0x38) == '\x02') {
          local_78._M_len = 9;
          local_78._M_str = "arg_in<%>";
          writer_base<cppwinrt::writer>::write_segment<winmd::reader::TypeSig>
                    (&w->super_writer_base<cppwinrt::writer>,&local_78,first);
        }
        else {
          writer::write(w,(int)first,first,(size_t)pPVar5);
        }
        bVar3 = winmd::reader::is_const(this->second);
        if (bVar3) {
          local_78._M_len = 7;
          local_78._M_str = " const&";
          writer_base<cppwinrt::writer>::write_impl
                    (&w->super_writer_base<cppwinrt::writer>,&local_78);
        }
      }
    }
    if (w->param_names == true) {
      local_78._M_len = 2;
      local_78._M_str = " %";
      local_58 = winmd::reader::Param::Name(&this->first);
      writer_base<cppwinrt::writer>::
      write_segment<std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,&local_78,&local_58);
    }
  }
  if (*(bool *)((long)&(local_60->m_signature).m_ret_type.m_type.
                       super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
                       super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
                       super__Optional_payload_base<winmd::reader::TypeSig> + 0x88) != false) {
    separator::operator()(&local_40);
    type = &(local_60->m_signature).m_ret_type.m_type;
    if ((local_60->m_signature).m_ret_type.m_type.
        super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
        super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
        super__Optional_payload_base<winmd::reader::TypeSig>._M_payload._M_value.m_is_szarray ==
        true) {
      local_78._M_len = 0x16;
      local_78._M_str = "uint32_t* __%Size, %**";
      local_58 = cppwinrt::method_signature::return_param_name(local_60);
      writer_base<cppwinrt::writer>::
      write_segment<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeSig>
                (&w->super_writer_base<cppwinrt::writer>,&local_78,&local_58,(TypeSig *)type);
    }
    else {
      write_abi_arg_out(w,(TypeSig *)type);
    }
    if (w->param_names == true) {
      local_78._M_len = 2;
      local_78._M_str = " %";
      local_58 = cppwinrt::method_signature::return_param_name(local_60);
      writer_base<cppwinrt::writer>::
      write_segment<std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,&local_78,&local_58);
    }
  }
  w->abi_types = bVar1;
  return;
}

Assistant:

static void write_abi_params(writer& w, method_signature const& method_signature)
    {
        auto abi_guard = w.push_abi_types(true);
        separator s{ w };

        for (auto&& [param, param_signature] : method_signature.params())
        {
            s();

            if (param_signature->Type().is_szarray())
            {
                std::string_view format;

                if (param.Flags().In())
                {
                    format = "uint32_t%, %";
                }
                else if (param_signature->ByRef())
                {
                    format = "uint32_t*%, %*";
                }
                else
                {
                    format = "uint32_t%, %";
                }

                w.write(format, bind<write_array_size_name>(param), bind<write_abi_arg_out>(param_signature->Type()));
            }
            else
            {
                if (param.Flags().In())
                {
                    write_abi_arg_in(w, param_signature->Type());

                    if (is_const(*param_signature))
                    {
                        w.write(" const&");
                    }
                }
                else
                {
                    write_abi_arg_out(w, param_signature->Type());
                }
            }

            if (w.param_names)
            {
                w.write(" %", param.Name());
            }
        }

        if (method_signature.return_signature())
        {
            s();

            auto const& type = method_signature.return_signature().Type();

            if (type.is_szarray())
            {
                w.write("uint32_t* __%Size, %**", method_signature.return_param_name(), type);
            }
            else
            {
                write_abi_arg_out(w, type);
            }

            if (w.param_names)
            {
                w.write(" %", method_signature.return_param_name());
            }
        }
    }